

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocess.cpp
# Opt level: O1

void __thiscall tsbp::PreprocessPacking2D::Run(PreprocessPacking2D *this)

{
  pointer pRVar1;
  ostream *poVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  PreprocessPacking2D *this_00;
  vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> newItems;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  int local_28;
  int iStack_24;
  pointer pRStack_20;
  pointer local_18;
  
  pRVar1 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pRVar1;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 5;
    piVar3 = &pRVar1->InternId;
    lVar5 = 0;
    do {
      *piVar3 = (int)lVar5;
      lVar5 = lVar5 + 1;
      piVar3 = piVar3 + 8;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  this_00 = (PreprocessPacking2D *)&stack0xffffffffffffffb0;
  std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::vector
            ((vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)&stack0xffffffffffffffb0,
             &this->items);
  local_38 = (this->container).super_Rectangle.X;
  iStack_34 = (this->container).super_Rectangle.Y;
  iStack_30 = (this->container).super_Rectangle.Dx;
  iStack_2c = (this->container).super_Rectangle.Dy;
  local_28 = (this->container).super_Rectangle.InternId;
  iStack_24 = (this->container).super_Rectangle.ExternId;
  pRStack_20 = (pointer)(this->container).super_Rectangle.Area;
  RemoveLargeItems(this_00,(vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)
                           &stack0xffffffffffffffb0,(Bin *)&stack0xffffffffffffffc8);
  FilterFrameConfigurations
            (this_00,(vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)
                     &stack0xffffffffffffffb0,(Bin *)&stack0xffffffffffffffc8);
  pRStack_20 = (pointer)(double)(iStack_2c * iStack_30);
  local_38 = 0;
  iStack_34 = 0;
  local_28 = -1;
  iStack_24 = -1;
  local_18 = pRStack_20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Preprocess removed ",0x13);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," items ",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"and reduced container area by ",0x1e);
  poVar2 = std::ostream::_M_insert<double>
                     ((this->container).super_Rectangle.Area - (double)local_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  if ((long)local_48 - (long)local_50 != 0) {
    lVar4 = (long)local_48 - (long)local_50 >> 5;
    piVar3 = &local_50->InternId;
    lVar5 = 0;
    do {
      *piVar3 = (int)lVar5;
      lVar5 = lVar5 + 1;
      piVar3 = piVar3 + 8;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  (this->PreprocessedContainer).super_Rectangle.InternId = local_28;
  (this->PreprocessedContainer).super_Rectangle.ExternId = iStack_24;
  (this->PreprocessedContainer).super_Rectangle.Area = (double)pRStack_20;
  (this->PreprocessedContainer).super_Rectangle.X = local_38;
  (this->PreprocessedContainer).super_Rectangle.Y = iStack_34;
  (this->PreprocessedContainer).super_Rectangle.Dx = iStack_30;
  (this->PreprocessedContainer).super_Rectangle.Dy = iStack_2c;
  std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::operator=
            (&this->ProcessedItems,
             (vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)&stack0xffffffffffffffb0);
  if (local_50 != (pointer)0x0) {
    operator_delete(local_50,(long)local_40 - (long)local_50);
  }
  return;
}

Assistant:

void PreprocessPacking2D::Run()
{
    InitializeInternIds(this->items);

    std::vector<Rectangle> newItems = this->items;
    Bin newContainer = this->container;

    RemoveLargeItems(newItems, newContainer);
    FilterFrameConfigurations(newItems, newContainer);
    ////EnlargeItemsByOrthogonalPacking(newItems, newContainer);

    // Reconstruct to correctly initialize area and volume.
    newContainer = Bin(0, 0, newContainer.Dx, newContainer.Dy, -1, -1);

    std::cout << "Preprocess removed " << this->items.size() - newItems.size() << " items "
              << "and reduced container area by " << this->container.Area - newContainer.Area << ".\n";

    InitializeInternIds(newItems);

    PreprocessedContainer = newContainer;
    ProcessedItems = newItems;
}